

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O0

VectorXd h(VectorXd *x)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  DenseIndex extraout_RDX;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RSI;
  double dVar2;
  VectorXd VVar3;
  double local_78;
  double local_70;
  double local_68;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_60;
  float local_3c;
  float local_38;
  float c;
  float vy;
  float vx;
  float py;
  float local_20;
  undefined1 local_19;
  float px;
  VectorXd *x_local;
  VectorXd *h_;
  
  local_19 = 0;
  _px = in_RSI;
  x_local = x;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(x,3);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(_px,0);
  local_20 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(_px,1);
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(_px,2);
  c = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(_px,3);
  local_38 = (float)*pdVar1;
  dVar2 = sqrt((double)(local_20 * local_20 + vy * vy));
  local_3c = (float)dVar2;
  local_68 = (double)local_3c;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_60,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x,&local_68);
  local_70 = atan2((double)vy,(double)local_20);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                   (&local_60,&local_70);
  local_78 = (double)((local_20 * c + vy * local_38) / local_3c);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_60);
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)x;
  return (VectorXd)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd h(const VectorXd &x){
	VectorXd h_(3);
	// read state vector
	float px = x(0);
	float py = x(1);
	float vx = x(2);
	float vy = x(3);

	// pre-compute term
	float c = sqrt(px*px + py*py);

	// set h function
	h_ << c, atan2(py,px), (px*vx + py*vy)/c;
	return h_;
}